

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall
lodepng::ExtractZlib::inflate
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,size_t inpos)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  pointer puVar5;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *this_00;
  long lVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  size_t bp;
  size_t pos;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  size_t local_38;
  
  bp = 0;
  pos = 0;
  this->error = 0;
  iVar8 = 0;
  bVar10 = false;
  local_48 = out;
  local_40 = in;
  while( true ) {
    sVar7 = bp;
    if (bVar10) {
      return;
    }
    if (iVar8 != 0) {
      return;
    }
    puVar5 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar5) <= bp >> 3) break;
    local_38 = pos;
    bVar10 = (puVar5[(bp >> 3) + inpos] >> ((uint)bp & 7) & 1) != 0;
    uVar1 = bp + 1;
    bVar3 = puVar5[(uVar1 >> 3) + inpos];
    uVar2 = bp + 2;
    bVar4 = puVar5[(uVar2 >> 3) + inpos];
    bp = bp + 3;
    this_00 = this->zlibinfo;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::resize
              (this_00,(*(long *)(this_00 + 8) - *(long *)this_00) / 0x130 + 1);
    in = local_40;
    uVar9 = (uint)(bVar4 >> ((byte)uVar2 & 7)) * 2 & 2 |
            (uint)((bVar3 >> ((uint)uVar1 & 7) & 1) != 0);
    *(uint *)(*(long *)(this->zlibinfo + 8) + -0x130) = uVar9;
    if (uVar9 == 0) {
      puVar5 = (local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      inflateNoCompression
                (this,local_48,puVar5 + inpos,&bp,&pos,
                 (long)(local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5);
    }
    else {
      if (uVar9 == 3) {
        iVar8 = 0x14;
        goto LAB_0011c749;
      }
      puVar5 = (local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      inflateHuffmanBlock(this,local_48,puVar5 + inpos,&bp,&pos,
                          (long)(local_40->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5,
                          (ulong)uVar9);
    }
    lVar6 = *(long *)(this->zlibinfo + 8);
    *(size_t *)(lVar6 + -0x128) = bp - sVar7;
    *(size_t *)(lVar6 + -0x120) = pos - local_38;
    iVar8 = this->error;
  }
  iVar8 = 0x34;
LAB_0011c749:
  this->error = iVar8;
  return;
}

Assistant:

void inflate(std::vector<unsigned char>& out, const std::vector<unsigned char>& in, size_t inpos = 0) {
    size_t bp = 0, pos = 0; //bit pointer and byte pointer
    error = 0;
    unsigned long BFINAL = 0;
    while(!BFINAL && !error) {
      size_t uncomprblockstart = pos;
      size_t bpstart = bp;
      if(bp >> 3 >= in.size()) { error = 52; return; } //error, bit pointer will jump past memory
      BFINAL = readBitFromStream(bp, &in[inpos]);
      unsigned long BTYPE = readBitFromStream(bp, &in[inpos]); BTYPE += 2 * readBitFromStream(bp, &in[inpos]);
      zlibinfo->resize(zlibinfo->size() + 1);
      zlibinfo->back().btype = BTYPE;
      if(BTYPE == 3) { error = 20; return; } //error: invalid BTYPE
      else if(BTYPE == 0) inflateNoCompression(out, &in[inpos], bp, pos, in.size());
      else inflateHuffmanBlock(out, &in[inpos], bp, pos, in.size(), BTYPE);
      size_t uncomprblocksize = pos - uncomprblockstart;
      zlibinfo->back().compressedbits = bp - bpstart;
      zlibinfo->back().uncompressedbytes = uncomprblocksize;
    }
  }